

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Execute<duckdb::string_t,long,duckdb::ArgMinMaxState<duckdb::string_t,long>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_long> *state,string_t x_data,long y_data,
          AggregateBinaryInput *binary)

{
  ulong uVar1;
  ulong uVar2;
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar3;
  string_t new_value;
  
  uVar1 = x_data.value._8_8_;
  new_value.value._0_8_ = x_data.value._0_8_;
  uVar2 = uVar1;
  if ((**(long **)(y_data + 0x10) != 0) &&
     (uVar2 = *(ulong *)(y_data + 0x20),
     (*(ulong *)(**(long **)(y_data + 0x10) + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0)) {
    return;
  }
  if ((long)uVar1 <= *(long *)(this + 0x18)) {
    return;
  }
  if (**(long **)(y_data + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0;
  }
  else {
    uVar2 = *(ulong *)(y_data + 0x18);
    AVar3 = (ArgMinMaxBase<duckdb::GreaterThan,false>)
            ((*(ulong *)(**(long **)(y_data + 8) + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0);
    this[1] = AVar3;
    if ((bool)AVar3) goto LAB_00494dcb;
  }
  new_value.value.pointer.ptr = (char *)uVar2;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),(string_t *)state,new_value);
LAB_00494dcb:
  *(ulong *)(this + 0x18) = uVar1;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}